

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

void cmsys::SystemTools::ReplaceString(string *source,char *replace,char *with)

{
  size_t replaceSize;
  size_t sVar1;
  char *__s;
  string local_50;
  
  if (*replace != '\0') {
    replaceSize = strlen(replace);
    __s = "";
    if (with != (char *)0x0) {
      __s = with;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar1);
    ReplaceString(source,replace,replaceSize,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void SystemTools::ReplaceString(kwsys_stl::string& source,
                                const char* replace,
                                const char* with)
{
  // do while hangs if replaceSize is 0
  if (!*replace)
    {
    return;
    }

  SystemTools::ReplaceString(source, replace, strlen(replace), with ? with : "");
}